

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Init.cpp
# Opt level: O2

Url * __thiscall Vault::Sys::Init::getUrl_abi_cxx11_(Url *__return_storage_ptr__,Init *this)

{
  long *plVar1;
  allocator<char> local_59;
  undefined8 *local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  string local_38 [32];
  
  plVar1 = *(long **)this;
  std::__cxx11::string::string<std::allocator<char>>(local_38,"/v1/sys/init",&local_59);
  local_58 = &local_48;
  local_48 = 0;
  uStack_40 = 0;
  local_50 = 0;
  (**(code **)(*plVar1 + 0x18))(__return_storage_ptr__,plVar1,local_38,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string(local_38);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Sys::Init::getUrl() {
  return client_.getUrl("/v1/sys/init", Path{});
}